

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeThumbTableBranch(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  DecodeStatus DVar3;
  uint RegNo;
  
  RegNo = Insn >> 0x10 & 0xf;
  DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  if (DVar1 == MCDisassembler_Success) {
    DVar1 = (uint)(RegNo != 0xc) * 2 + MCDisassembler_SoftFail;
  }
  else {
    if (DVar1 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    DVar1 = MCDisassembler_SoftFail;
  }
  DVar2 = DecoderGPRRegisterClass(Inst,Insn & 0xf,Address_00,Decoder);
  DVar3 = DVar2;
  if (((DVar2 != MCDisassembler_Fail) && (DVar3 = DVar1, DVar2 != MCDisassembler_Success)) &&
     (DVar3 = DVar2, DVar2 != MCDisassembler_SoftFail)) {
    DVar3 = MCDisassembler_Fail;
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeThumbTableBranch(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);

	if (Rn == ARM_SP) S = MCDisassembler_SoftFail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}